

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_dbg.c
# Opt level: O1

int tool_debug_cb(CURL *handle,curl_infotype type,char *data,size_t size,void *userdata)

{
  trace tVar1;
  GlobalConfig *config;
  size_t sVar2;
  char cVar3;
  int iVar4;
  tm *ptVar5;
  FILE *pFVar6;
  FILE **ppFVar7;
  FILE *__stream;
  size_t sVar8;
  long lVar9;
  char *pcVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  size_t sVar14;
  ulong uVar15;
  timeval tVar16;
  char timebuf [20];
  curl_off_t xfer_id;
  char idsbuf [60];
  curl_off_t conn_id;
  char local_a8 [24];
  long local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78 [8];
  long local_38;
  
  __stream = (FILE *)tool_stderr;
  config = *(GlobalConfig **)((long)userdata + 0x3b0);
  if ((config->field_0x63 & 0x20) == 0) {
    local_a8[0] = '\0';
  }
  else {
    tVar16 = tvrealnow();
    local_78[0] = tVar16.tv_sec;
    if (hms_for_sec_cached_tv_sec != local_78[0]) {
      ptVar5 = localtime((time_t *)local_78);
      curl_msnprintf(hms_for_sec_hms_buf,0xc,"%02d:%02d:%02d",ptVar5->tm_hour,ptVar5->tm_min,
                     ptVar5->tm_sec);
      hms_for_sec_cached_tv_sec = local_78[0];
    }
    curl_msnprintf(local_a8,0x14,"%s.%06ld ",hms_for_sec_hms_buf,tVar16.tv_usec);
  }
  if ((((handle == (CURL *)0x0) || ((config->field_0x63 & 0x40) == 0)) ||
      (iVar4 = curl_easy_getinfo(handle,0x60003f,&local_90), iVar4 != 0)) || (local_90 < 0)) {
    local_78[0] = local_78[0] & 0xffffffffffffff00;
  }
  else {
    iVar4 = curl_easy_getinfo(handle,0x600040,&local_38);
    if (local_38 < 0 || iVar4 != 0) {
      curl_msnprintf(local_78,0x3c,"[%ld-x] ",local_90);
    }
    else {
      curl_msnprintf(local_78,0x3c,"[%ld-%ld] ",local_90);
    }
  }
  if (config->trace_stream == (FILE *)0x0) {
    pcVar10 = config->trace_dump;
    iVar4 = strcmp("-",pcVar10);
    if (iVar4 == 0) {
      ppFVar7 = (FILE **)&stdout;
    }
    else {
      iVar4 = strcmp("%",pcVar10);
      if (iVar4 != 0) {
        pFVar6 = fopen64(pcVar10,"w");
        config->trace_stream = (FILE *)pFVar6;
        config->field_0x63 = config->field_0x63 | 0x10;
        goto LAB_0010ac4f;
      }
      ppFVar7 = &tool_stderr;
    }
    config->trace_stream = *ppFVar7;
  }
LAB_0010ac4f:
  if ((FILE *)config->trace_stream != (FILE *)0x0) {
    __stream = (FILE *)config->trace_stream;
  }
  if (__stream == (FILE *)0x0) {
    warnf(config,"Failed to create/open output");
    return 0;
  }
  tVar1 = config->tracetype;
  if (tVar1 == TRACE_PLAIN) {
    if (type - CURLINFO_DATA_IN < 4) {
      if (tool_debug_cb_traced_data != '\0') {
        return 0;
      }
      if ((config->field_0x64 & 4) != 0) {
        if (__stream == (FILE *)tool_stderr) {
          return 0;
        }
        if (__stream == _stdout) {
          return 0;
        }
      }
      if (tool_debug_cb::newl == false) {
        log_line_start((FILE *)__stream,local_a8,(char *)local_78,type);
      }
      curl_mfprintf(__stream,"[%zu bytes data]\n",size);
      tool_debug_cb::newl = false;
      tool_debug_cb_traced_data = 1;
      return 0;
    }
    if (type < CURLINFO_HEADER_OUT) {
      if (tool_debug_cb::newl == false) {
        log_line_start((FILE *)__stream,local_a8,(char *)local_78,type);
      }
      fwrite(data,size,1,__stream);
      if (size != 0) {
LAB_0010b0f9:
        tool_debug_cb::newl = data[size - 1] != '\n';
        tool_debug_cb_traced_data = 0;
        return 0;
      }
    }
    else {
      if (type != CURLINFO_HEADER_OUT) {
        tool_debug_cb::newl = false;
        tool_debug_cb_traced_data = 0;
        return 0;
      }
      if (size != 0) {
        if (size == 1) {
          lVar9 = 1;
          sVar14 = 0;
          sVar8 = 0;
        }
        else {
          lVar9 = 0;
          sVar14 = 0;
          sVar2 = 1;
          do {
            sVar8 = sVar2;
            if (data[sVar8 - 1] == '\n') {
              if (tool_debug_cb::newl == false) {
                log_line_start((FILE *)__stream,local_a8,(char *)local_78,CURLINFO_HEADER_OUT);
              }
              fwrite(data + sVar14,lVar9 + sVar8,1,__stream);
              tool_debug_cb::newl = false;
              sVar14 = sVar8;
            }
            lVar9 = -sVar14;
            sVar2 = sVar8 + 1;
          } while (size != sVar8 + 1);
          lVar9 = 1 - sVar14;
        }
        if (tool_debug_cb::newl == false) {
          log_line_start((FILE *)__stream,local_a8,(char *)local_78,CURLINFO_HEADER_OUT);
        }
        fwrite(data + sVar14,lVar9 + sVar8,1,__stream);
        goto LAB_0010b0f9;
      }
    }
    tool_debug_cb::newl = false;
    tool_debug_cb_traced_data = 0;
    return 0;
  }
  switch(type) {
  case CURLINFO_TEXT:
    curl_mfprintf(__stream,"%s%s== Info: %.*s",local_a8,local_78,size & 0xffffffff,data);
    return 0;
  case CURLINFO_HEADER_IN:
    pcVar10 = "<= Recv header";
    break;
  case CURLINFO_HEADER_OUT:
    pcVar10 = "=> Send header";
    break;
  case CURLINFO_DATA_IN:
    pcVar10 = "<= Recv data";
    break;
  case CURLINFO_DATA_OUT:
    pcVar10 = "=> Send data";
    break;
  case CURLINFO_SSL_DATA_IN:
    pcVar10 = "<= Recv SSL data";
    break;
  case CURLINFO_SSL_DATA_OUT:
    pcVar10 = "=> Send SSL data";
    break;
  default:
    goto switchD_0010ad43_default;
  }
  curl_mfprintf(__stream,"%s%s%s, %zu bytes (0x%zx)\n",local_a8,local_78,pcVar10,size,size);
  if (size != 0) {
    local_80 = 0xfffffffffffffff0;
    if (tVar1 == TRACE_ASCII) {
      local_80 = 0xffffffffffffffc0;
    }
    lVar9 = 0x10;
    if (tVar1 == TRACE_ASCII) {
      lVar9 = 0x40;
    }
    local_88 = local_80 ^ 0xfffffffffffffffd;
    local_80 = local_80 ^ 0xfffffffffffffffe;
    uVar15 = 0;
    do {
      curl_mfprintf(__stream,"%04zx: ",uVar15);
      uVar11 = uVar15;
      lVar12 = lVar9;
      if (tVar1 == TRACE_BIN) {
        do {
          if (uVar11 < size) {
            curl_mfprintf(__stream,"%02x ",data[uVar11]);
          }
          else {
            fputs("   ",__stream);
          }
          lVar12 = lVar12 + -1;
          uVar11 = uVar11 + 1;
        } while (lVar12 != 0);
      }
      lVar12 = 0;
      uVar11 = local_80;
      pcVar10 = data;
      uVar13 = local_88;
      do {
        if (size <= uVar15 + lVar12) break;
        if (tVar1 == TRACE_ASCII) {
          if (((uVar15 + lVar12 + 1 < size) && (pcVar10[uVar15] == '\r')) &&
             (pcVar10[uVar15 + 1] == '\n')) {
            uVar15 = uVar15 - uVar11;
            break;
          }
          cVar3 = pcVar10[uVar15];
          if (0x5e < (byte)(cVar3 - 0x20U)) {
            cVar3 = '.';
          }
          curl_mfprintf(__stream,"%c",cVar3);
          if (((uVar15 + lVar12 + 2 < size) && (pcVar10[uVar15 + 1] == '\r')) &&
             (pcVar10[uVar15 + 2] == '\n')) {
            uVar15 = uVar15 - uVar13;
            break;
          }
        }
        else {
          cVar3 = pcVar10[uVar15];
          if (0x5e < (byte)(cVar3 - 0x20U)) {
            cVar3 = '.';
          }
          curl_mfprintf(__stream,"%c",cVar3);
        }
        lVar12 = lVar12 + 1;
        uVar13 = uVar13 - 1;
        uVar11 = uVar11 - 1;
        pcVar10 = pcVar10 + 1;
      } while (lVar9 != lVar12);
      fputc(10,__stream);
      uVar15 = uVar15 + lVar9;
    } while (uVar15 < size);
  }
  fflush(__stream);
switchD_0010ad43_default:
  return 0;
}

Assistant:

int tool_debug_cb(CURL *handle, curl_infotype type,
                  char *data, size_t size,
                  void *userdata)
{
  struct OperationConfig *operation = userdata;
  struct GlobalConfig *config = operation->global;
  FILE *output = tool_stderr;
  const char *text;
  struct timeval tv;
  char timebuf[20];
  /* largest signed 64-bit is: 9,223,372,036,854,775,807
   * max length in decimal: 1 + (6*3) = 19
   * formatted via TRC_IDS_FORMAT_IDS_2 this becomes 2 + 19 + 1 + 19 + 2 = 43
   * negative xfer-id are not printed, negative conn-ids use TRC_IDS_FORMAT_1
   */
  char idsbuf[60];
  curl_off_t xfer_id, conn_id;

  (void)handle; /* not used */

  if(config->tracetime) {
    tv = tvrealnow();
    msnprintf(timebuf, sizeof(timebuf), "%s.%06ld ",
              hms_for_sec(tv.tv_sec), (long)tv.tv_usec);
  }
  else
    timebuf[0] = 0;

  if(handle && config->traceids &&
     !curl_easy_getinfo(handle, CURLINFO_XFER_ID, &xfer_id) && xfer_id >= 0) {
    if(!curl_easy_getinfo(handle, CURLINFO_CONN_ID, &conn_id) &&
        conn_id >= 0) {
      msnprintf(idsbuf, sizeof(idsbuf), TRC_IDS_FORMAT_IDS_2,
                xfer_id, conn_id);
    }
    else {
      msnprintf(idsbuf, sizeof(idsbuf), TRC_IDS_FORMAT_IDS_1, xfer_id);
    }
  }
  else
    idsbuf[0] = 0;

  if(!config->trace_stream) {
    /* open for append */
    if(!strcmp("-", config->trace_dump))
      config->trace_stream = stdout;
    else if(!strcmp("%", config->trace_dump))
      /* Ok, this is somewhat hackish but we do it undocumented for now */
      config->trace_stream = tool_stderr;
    else {
      config->trace_stream = fopen(config->trace_dump, FOPEN_WRITETEXT);
      config->trace_fopened = TRUE;
    }
  }

  if(config->trace_stream)
    output = config->trace_stream;

  if(!output) {
    warnf(config, "Failed to create/open output");
    return 0;
  }

  if(config->tracetype == TRACE_PLAIN) {
    static bool newl = FALSE;
    static bool traced_data = FALSE;

    switch(type) {
    case CURLINFO_HEADER_OUT:
      if(size > 0) {
        size_t st = 0;
        size_t i;
        for(i = 0; i < size - 1; i++) {
          if(data[i] == '\n') { /* LF */
            if(!newl) {
              log_line_start(output, timebuf, idsbuf, type);
            }
            (void)fwrite(data + st, i - st + 1, 1, output);
            st = i + 1;
            newl = FALSE;
          }
        }
        if(!newl)
          log_line_start(output, timebuf, idsbuf, type);
        (void)fwrite(data + st, i - st + 1, 1, output);
      }
      newl = (size && (data[size - 1] != '\n'));
      traced_data = FALSE;
      break;
    case CURLINFO_TEXT:
    case CURLINFO_HEADER_IN:
      if(!newl)
        log_line_start(output, timebuf, idsbuf, type);
      (void)fwrite(data, size, 1, output);
      newl = (size && (data[size - 1] != '\n'));
      traced_data = FALSE;
      break;
    case CURLINFO_DATA_OUT:
    case CURLINFO_DATA_IN:
    case CURLINFO_SSL_DATA_IN:
    case CURLINFO_SSL_DATA_OUT:
      if(!traced_data) {
        /* if the data is output to a tty and we are sending this debug trace
           to stderr or stdout, we do not display the alert about the data not
           being shown as the data _is_ shown then just not via this
           function */
        if(!config->isatty ||
           ((output != tool_stderr) && (output != stdout))) {
          if(!newl)
            log_line_start(output, timebuf, idsbuf, type);
          fprintf(output, "[%zu bytes data]\n", size);
          newl = FALSE;
          traced_data = TRUE;
        }
      }
      break;
    default: /* nada */
      newl = FALSE;
      traced_data = FALSE;
      break;
    }

    return 0;
  }

  switch(type) {
  case CURLINFO_TEXT:
    fprintf(output, "%s%s== Info: %.*s", timebuf, idsbuf, (int)size, data);
    FALLTHROUGH();
  default: /* in case a new one is introduced to shock us */
    return 0;

  case CURLINFO_HEADER_OUT:
    text = "=> Send header";
    break;
  case CURLINFO_DATA_OUT:
    text = "=> Send data";
    break;
  case CURLINFO_HEADER_IN:
    text = "<= Recv header";
    break;
  case CURLINFO_DATA_IN:
    text = "<= Recv data";
    break;
  case CURLINFO_SSL_DATA_IN:
    text = "<= Recv SSL data";
    break;
  case CURLINFO_SSL_DATA_OUT:
    text = "=> Send SSL data";
    break;
  }

  dump(timebuf, idsbuf, text, output, (unsigned char *) data, size,
       config->tracetype, type);
  return 0;
}